

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

void __thiscall QWaitCondition::wakeAll(QWaitCondition *this)

{
  long *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  pthread_mutex_lock((pthread_mutex_t *)*in_RDI);
  qt_report_pthread_error((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,(char *)0x6d99a4);
  *(undefined4 *)(*in_RDI + 0x5c) = *(undefined4 *)(*in_RDI + 0x58);
  pthread_cond_broadcast((pthread_cond_t *)(*in_RDI + 0x28));
  qt_report_pthread_error((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,(char *)0x6d99d6);
  pthread_mutex_unlock((pthread_mutex_t *)*in_RDI);
  qt_report_pthread_error((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,(char *)0x6d99f8);
  return;
}

Assistant:

void QWaitCondition::wakeAll()
{
    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wakeAll()",
                            "mutex lock");
    d->wakeups = d->waiters;
    qt_report_pthread_error(pthread_cond_broadcast(&d->cond), "QWaitCondition::wakeAll()",
                            "cv broadcast");
    qt_report_pthread_error(pthread_mutex_unlock(&d->mutex), "QWaitCondition::wakeAll()",
                            "mutex unlock");
}